

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall DataSet::normalize(DataSet *this,double beg,double end)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  const_reference pvVar3;
  double *pdVar4;
  uint local_40;
  uint local_3c;
  uint j_1;
  uint j;
  double max;
  double min;
  uint i;
  double end_local;
  double beg_local;
  DataSet *this_local;
  
  for (min._4_4_ = 0; min._4_4_ < (this->m_inputSet).m_shape.field_0.m_dims[1];
      min._4_4_ = min._4_4_ + 1) {
    max = 0.0;
    _j_1 = 0.0;
    for (local_3c = 0; local_3c < (this->m_inputSet).m_shape.field_0.m_dims[0];
        local_3c = local_3c + 1) {
      pvVar2 = Matrix::operator[](&this->m_inputSet,local_3c);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(ulong)min._4_4_);
      if (_j_1 < *pvVar3) {
        pvVar2 = Matrix::operator[](&this->m_inputSet,local_3c);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(ulong)min._4_4_);
        _j_1 = *pvVar3;
      }
      pvVar2 = Matrix::operator[](&this->m_inputSet,local_3c);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(ulong)min._4_4_);
      if (*pvVar3 <= max && max != *pvVar3) {
        pvVar2 = Matrix::operator[](&this->m_inputSet,local_3c);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(ulong)min._4_4_);
        max = *pvVar3;
      }
    }
    for (local_40 = 0; local_40 < (this->m_inputSet).m_shape.field_0.m_dims[0];
        local_40 = local_40 + 1) {
      pvVar2 = Matrix::operator[](&this->m_inputSet,local_40);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(ulong)min._4_4_);
      dVar1 = *pvVar3;
      pdVar4 = Matrix::set(&this->m_inputSet,local_40,min._4_4_);
      *pdVar4 = (dVar1 - max) / (_j_1 - max);
    }
  }
  return;
}

Assistant:

void DataSet::normalize(double beg, double end){
    for(uint i=0;i<m_inputSet.m_shape.n_col;++i){
        double min=0, max=0;
        for(uint j=0;j<m_inputSet.m_shape.n_row;++j){
            if(max<m_inputSet[j][i]) max=m_inputSet[j][i];
            if(min>m_inputSet[j][i]) min=m_inputSet[j][i];
        }
        for(uint j=0;j<m_inputSet.m_shape.n_row;++j){
            m_inputSet.set(j, i)=(m_inputSet[j][i]-min)/(max-min);
        }
    }
}